

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeoutMonitor.cpp
# Opt level: O0

void __thiscall
helics::TimeoutMonitor::pingReply(TimeoutMonitor *this,ActionMessage *cmd,CoreBroker *brk)

{
  bool bVar1;
  reference plVar2;
  __uniq_ptr_data<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>,_true,_true>
  in_RDX;
  long in_RSI;
  long in_RDI;
  ActionMessage noforward;
  linkConnection *conn;
  iterator __end2;
  iterator __begin2;
  vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *__range2;
  bool waswaiting;
  bool waiting;
  ActionMessage *in_stack_fffffffffffffed8;
  __normal_iterator<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
  *in_stack_fffffffffffffee0;
  BrokerBase *this_00;
  action_t in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  __normal_iterator<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
  local_30;
  long local_28;
  byte local_1e;
  byte local_1d;
  BaseType local_1c;
  __uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
  local_18;
  undefined8 local_10;
  
  local_1c = *(BaseType *)(in_RDI + 0x1c);
  local_18._M_t.
  super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
  .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl =
       (tuple<helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>)
       (tuple<helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>)
       in_RDX.
       super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
       ._M_t.
       super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
       .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
  local_10 = in_RSI;
  bVar1 = GlobalFederateId::operator==((GlobalFederateId *)(in_RSI + 8),(GlobalFederateId)local_1c);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x18) = 0;
    *(undefined1 *)(in_RDI + 8) = 0;
  }
  else {
    local_1d = 0;
    local_1e = 0;
    local_28 = in_RDI + 0x28;
    local_30._M_current =
         (linkConnection *)
         std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::begin
                   ((vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *)
                    in_stack_fffffffffffffed8);
    std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::end
              ((vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *)
               in_stack_fffffffffffffed8);
    while (bVar1 = __gnu_cxx::
                   operator==<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
                             (in_stack_fffffffffffffee0,
                              (__normal_iterator<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
                               *)in_stack_fffffffffffffed8), ((bVar1 ^ 0xffU) & 1) != 0) {
      plVar2 = __gnu_cxx::
               __normal_iterator<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
               ::operator*(&local_30);
      bVar1 = GlobalFederateId::operator==
                        ((GlobalFederateId *)(local_10 + 8),
                         (GlobalFederateId)(plVar2->connection).gid);
      if (bVar1) {
        local_1e = plVar2->waitingForPingReply & 1;
        plVar2->waitingForPingReply = false;
      }
      if ((plVar2->waitingForPingReply & 1U) != 0) {
        local_1d = 1;
      }
      __gnu_cxx::
      __normal_iterator<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
      ::operator++(&local_30);
    }
    if ((((local_1d & 1) == 0) && ((local_1e & 1) != 0)) &&
       (local_18._M_t.
        super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
        .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
         )0x0)) {
      this_00 = (BrokerBase *)&stack0xffffffffffffff00;
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffefc);
      BrokerBase::addActionMessage(this_00,in_stack_fffffffffffffed8);
      ActionMessage::~ActionMessage((ActionMessage *)this_00);
    }
  }
  return;
}

Assistant:

void TimeoutMonitor::pingReply(const ActionMessage& cmd, CoreBroker* brk)
{
    if (cmd.source_id == GlobalFederateId(parentConnection.connection)) {
        parentConnection.waitingForPingReply = false;
        waitingForConnection = false;
    } else {
        bool waiting{false};
        bool waswaiting{false};
        for (auto& conn : connections) {
            if (cmd.source_id == GlobalFederateId(conn.connection)) {
                waswaiting = conn.waitingForPingReply;
                conn.waitingForPingReply = false;
            }
            if (conn.waitingForPingReply) {
                waiting = true;
            }
        }
        if (!waiting && waswaiting) {
            if (brk != nullptr) {
                ActionMessage noforward(CMD_BROKER_CONFIGURE);
                noforward.dest_id = cmd.dest_id;
                noforward.source_id = cmd.dest_id;
                noforward.messageID = REQUEST_TICK_FORWARDING;
                brk->addActionMessage(noforward);
            }
        }
    }
}